

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::TestCaseInfo::tagsAsString_abi_cxx11_(string *__return_storage_ptr__,TestCaseInfo *this)

{
  pointer pTVar1;
  const_iterator __begin1;
  const_iterator __end1;
  size_type __res;
  Tag *tag_1;
  pointer pTVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pTVar2 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __res = (long)pTVar1 - (long)pTVar2 >> 4;
  for (; pTVar1 != pTVar2; pTVar2 = pTVar2 + 1) {
    __res = __res + (pTVar2->original).m_size;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  pTVar1 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'[');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(pTVar2->original).m_start,(pTVar2->original).m_size);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseInfo::tagsAsString() const {
        std::string ret;
        // '[' and ']' per tag
        std::size_t full_size = 2 * tags.size();
        for (const auto &tag : tags) {
            full_size += tag.original.size();
        }
        ret.reserve(full_size);
        for (const auto &tag : tags) {
            ret.push_back('[');
            ret += tag.original;
            ret.push_back(']');
        }

        return ret;
    }